

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

void __thiscall
gl3cts::SparseBuffersWithCopyOpsTest::SparseBuffersWithCopyOpsTest
          (SparseBuffersWithCopyOpsTest *this,Context *context)

{
  uint local_1c;
  uint n;
  Context *context_local;
  SparseBuffersWithCopyOpsTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"CommonBug_SparseBuffersWithCopyOps",
             "Verifies sparse buffer functionality works correctly when CPU->GPU and GPU->GPU memory transfers are involved."
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SparseBuffersWithCopyOpsTest_0324dcb8;
  this->m_bo_id = 0;
  this->m_bo_read_id = 0;
  this->m_clear_buffer = (uchar *)0x0;
  this->m_page_size = 0;
  this->m_result_data_storage_size = 0;
  this->m_n_iterations_to_run = 0x10;
  this->m_n_pages_to_test = 0x10;
  this->m_virtual_bo_size = 0x1f460000;
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    this->m_reference_data[local_1c] = (uchar)local_1c;
  }
  return;
}

Assistant:

SparseBuffersWithCopyOpsTest::SparseBuffersWithCopyOpsTest(deqp::Context& context)
	: TestCase(context, "CommonBug_SparseBuffersWithCopyOps",
			   "Verifies sparse buffer functionality works correctly when CPU->GPU and GPU->GPU"
			   " memory transfers are involved.")
	, m_bo_id(0)
	, m_bo_read_id(0)
	, m_clear_buffer(DE_NULL)
	, m_page_size(0)
	, m_result_data_storage_size(0)
	, m_n_iterations_to_run(16)
	, m_n_pages_to_test(16)
	, m_virtual_bo_size(512 /* MB */ * 1024768)
{
	for (unsigned int n = 0; n < sizeof(m_reference_data) / sizeof(m_reference_data[0]); ++n)
	{
		m_reference_data[n] = static_cast<unsigned char>(n);
	}
}